

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlib.c
# Opt level: O1

void xpose(float *indata,long iRsiz,float *outdata,long oRsiz,long Nrows,long Ncols)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  bool bVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  
  if (7 < Nrows) {
    pfVar12 = outdata + 7;
    uVar13 = (ulong)Nrows >> 3;
    do {
      pfVar10 = pfVar12;
      pfVar11 = indata;
      lVar14 = Ncols + 1;
      if (0 < Ncols) {
        do {
          fVar1 = pfVar11[iRsiz];
          fVar2 = pfVar11[iRsiz * 2];
          fVar3 = pfVar11[iRsiz * 3];
          fVar4 = pfVar11[iRsiz * 4];
          fVar5 = pfVar11[iRsiz * 5];
          fVar6 = pfVar11[iRsiz * 6];
          fVar7 = pfVar11[iRsiz * 7];
          pfVar10[-7] = *pfVar11;
          pfVar10[-6] = fVar1;
          pfVar10[-5] = fVar2;
          pfVar10[-4] = fVar3;
          pfVar10[-3] = fVar4;
          pfVar10[-2] = fVar5;
          pfVar10[-1] = fVar6;
          *pfVar10 = fVar7;
          lVar14 = lVar14 + -1;
          pfVar10 = pfVar10 + oRsiz;
          pfVar11 = pfVar11 + 1;
        } while (1 < lVar14);
      }
      indata = indata + iRsiz * 8;
      outdata = outdata + 8;
      pfVar12 = pfVar12 + 8;
      bVar8 = 1 < (long)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar8);
  }
  lVar14 = Nrows % 8;
  if (0 < Ncols && lVar14 != 0) {
    do {
      lVar9 = lVar14 + 1;
      pfVar12 = indata;
      pfVar10 = outdata;
      if (0 < lVar14) {
        do {
          *pfVar10 = *pfVar12;
          lVar9 = lVar9 + -1;
          pfVar12 = pfVar12 + iRsiz;
          pfVar10 = pfVar10 + 1;
        } while (1 < lVar9);
      }
      indata = indata + 1;
      outdata = outdata + oRsiz;
      bVar8 = 1 < Ncols;
      Ncols = Ncols + -1;
    } while (bVar8);
  }
  return;
}

Assistant:

void xpose(float *indata, long iRsiz, float *outdata, long oRsiz, long Nrows, long Ncols){
/* not in-place matrix transpose	*/
/* INPUTS */
/* *indata = input data array	*/
/* iRsiz = offset to between rows of input data array	*/
/* oRsiz = offset to between rows of output data array	*/
/* Nrows = number of rows in input data array	*/
/* Ncols = number of columns in input data array	*/
/* OUTPUTS */
/* *outdata = output data array	*/

float	*irow; 		/* pointer to input row start */
float	*ocol; 		/* pointer to output col start */
float	*idata; 	/* pointer to input data */
float	*odata; 	/* pointer to output data */
long 	RowCnt;		/* row counter */
long 	ColCnt;		/* col counter */
float	T0; 		/* data storage */
float	T1; 		/* data storage */
float	T2; 		/* data storage */
float	T3; 		/* data storage */
float	T4; 		/* data storage */
float	T5; 		/* data storage */
float	T6; 		/* data storage */
float	T7; 		/* data storage */
const long inRsizd1 = iRsiz;
const long inRsizd2 = 2*iRsiz;
const long inRsizd3 = inRsizd2+iRsiz;
const long inRsizd4 = 4*iRsiz;
const long inRsizd5 = inRsizd3+inRsizd2;
const long inRsizd6 = inRsizd4+inRsizd2;
const long inRsizd7 = inRsizd4+inRsizd3;
const long inRsizd8 = 8*iRsiz;

ocol = outdata;
irow = indata;
for (RowCnt=Nrows/8; RowCnt>0; RowCnt--){
	idata = irow;
	odata = ocol;
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		T0 = *idata;
		T1 = *(idata+inRsizd1);
		T2 = *(idata+inRsizd2);
		T3 = *(idata+inRsizd3);
		T4 = *(idata+inRsizd4);
		T5 = *(idata+inRsizd5);
		T6 = *(idata+inRsizd6);
		T7 = *(idata+inRsizd7);
		*odata = T0;
		*(odata+1) = T1;
		*(odata+2) = T2;
		*(odata+3) = T3;
		*(odata+4) = T4;
		*(odata+5) = T5;
		*(odata+6) = T6;
		*(odata+7) = T7;
		idata++;
		odata += oRsiz;
	}
	irow += inRsizd8;
	ocol += 8;
}
if (Nrows%8 != 0){
	for (ColCnt=Ncols; ColCnt>0; ColCnt--){
		idata = irow++;
		odata = ocol;
		ocol += oRsiz;
		for (RowCnt=Nrows%8; RowCnt>0; RowCnt--){
			T0 = *idata;
			*odata++ = T0;
			idata += iRsiz;
		}
	}
}
}